

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

int VP8LColorSpaceTransform
              (int width,int height,int bits,int quality,uint32_t *argb,uint32_t *image,
              WebPPicture *pic,int percent_range,int *percent,int *best_bits)

{
  int *piVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int64_t iVar7;
  int64_t iVar8;
  long lVar9;
  undefined4 in_register_0000000c;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  undefined4 in_register_00000034;
  uint uVar14;
  uint uVar15;
  VP8LMultipliers prev_x;
  VP8LMultipliers prev_y;
  uint32_t *puVar16;
  int iVar17;
  int iVar18;
  int tile_width;
  bool bVar19;
  VP8LMultipliers local_944;
  ulong local_940;
  uint local_938;
  uint local_934;
  uint local_930;
  uint local_92c;
  uint local_928;
  int local_924;
  uint32_t *local_920;
  ulong local_918;
  ulong local_910;
  ulong local_908;
  undefined8 local_900;
  ulong local_8f8;
  ulong local_8f0;
  uint32_t *local_8e8;
  int local_8dc;
  uint local_8d8;
  int local_8d4;
  undefined8 local_8d0;
  long local_8c8;
  ulong local_8c0;
  ulong local_8b8;
  ulong local_8b0;
  uint32_t *local_8a8;
  ulong local_8a0;
  ulong local_898;
  uint32_t *local_890;
  ulong local_888;
  long local_880;
  ulong local_878;
  ulong local_870;
  uint32_t *local_868;
  long local_860;
  long local_858;
  ulong local_850;
  ulong local_848;
  long local_840;
  uint32_t accumulated_blue_histo [256];
  uint32_t accumulated_red_histo [256];
  
  local_8d0 = CONCAT44(in_register_00000034,height);
  local_900 = CONCAT44(in_register_0000000c,quality);
  bVar4 = (byte)bits;
  uVar11 = 1 << (bVar4 & 0x1f);
  local_918 = (ulong)uVar11;
  local_934 = (uVar11 + width) - 1 >> (bVar4 & 0x1f);
  uVar11 = (uVar11 + height) - 1;
  bVar3 = bVar4 & 0x1f;
  uVar13 = uVar11 >> bVar3;
  local_898 = (ulong)(uint)*percent;
  local_920 = image;
  memset(accumulated_red_histo,0,0x400);
  memset(accumulated_blue_histo,0,0x400);
  local_938 = uVar13;
  if (0 < (int)(uVar11 >> bVar3)) {
    uVar11 = (int)local_900 * 7 >> 8;
    local_878 = (ulong)uVar11;
    local_8d4 = uVar11 + 3;
    local_848 = (ulong)(0x32 < (int)local_900) * 3 + 4;
    local_880 = (long)(width + 2);
    local_8c8 = (long)(int)local_934;
    local_8a0 = (ulong)uVar13;
    local_888 = (ulong)local_934;
    local_840 = (long)width * 4;
    local_890 = argb + -(long)width;
    uVar12 = 0;
    local_928 = 0;
    local_92c = 0;
    local_930 = 0;
    local_910 = 0;
    uVar13 = 0 >> bVar3;
    uVar11 = 0;
    local_940 = (ulong)(uint)width;
    local_8a8 = argb;
    do {
      local_8c0 = uVar12;
      if (0 < (int)local_934) {
        uVar14 = (int)uVar12 << (bVar4 & 0x1f);
        local_8b0 = (ulong)uVar14;
        local_8d8 = uVar14 + (int)local_918;
        uVar15 = (uint)local_8d0;
        if ((int)uVar15 <= (int)local_8d8) {
          local_8d8 = uVar15;
        }
        local_860 = uVar12 * local_8c8;
        iVar5 = local_8d8 - uVar14;
        uVar6 = uVar14 * (int)local_940;
        local_8b8 = (ulong)uVar6;
        local_868 = argb + (int)uVar6;
        local_870 = (ulong)(uVar15 - uVar14);
        if ((int)local_918 < (int)(uVar15 - uVar14)) {
          local_870 = local_918 & 0xffffffff;
        }
        local_8dc = (int)local_870 + 1;
        uVar12 = 0;
        do {
          uVar15 = (int)uVar12 << (bVar4 & 0x1f);
          local_908 = (ulong)uVar15;
          local_924 = (int)local_918 + uVar15;
          iVar17 = (int)local_940;
          if (iVar17 <= local_924) {
            local_924 = iVar17;
          }
          local_858 = uVar12 + local_860;
          if (local_8c0 != 0) {
            local_928 = local_920[local_858 - local_8c8];
            local_92c = local_928 >> 8;
            local_930 = local_928 >> 0x10;
          }
          prev_x = (VP8LMultipliers)
                   ((uint3)(byte)local_910 |
                   (uint3)((uVar13 & 0xff) << 8) | (uint3)((uVar11 & 0xff) << 0x10));
          prev_y = (VP8LMultipliers)
                   ((uint3)local_928 & 0xff |
                   (uint3)((local_92c & 0xff) << 8) | (uint3)((local_930 & 0xff) << 0x10));
          tile_width = local_924 - uVar15;
          local_8e8 = local_868 + (int)uVar15;
          local_850 = uVar12;
          iVar7 = GetPredictionCostCrossColorRed
                            (local_8e8,iVar17,tile_width,iVar5,prev_x,prev_y,0,accumulated_red_histo
                            );
          uVar13 = 0;
          uVar12 = 0;
          if (-4 < (int)local_878) {
            uVar12 = 0;
            uVar10 = 0;
            do {
              puVar16 = local_8e8;
              uVar11 = 0x20 >> ((byte)uVar10 & 0x1f);
              local_8f0 = (ulong)uVar11;
              iVar17 = -uVar11;
              local_8f8 = uVar10;
              do {
                uVar15 = (int)uVar12 + iVar17;
                iVar8 = GetPredictionCostCrossColorRed
                                  (puVar16,(int)local_940,tile_width,iVar5,prev_x,prev_y,uVar15,
                                   accumulated_red_histo);
                if (iVar8 < iVar7) {
                  uVar12 = (ulong)uVar15;
                  iVar7 = iVar8;
                }
                iVar17 = iVar17 + uVar11 * 2;
              } while (iVar17 <= (int)local_8f0);
              uVar10 = (ulong)((int)local_8f8 + 1);
            } while ((int)local_8f8 != local_8d4);
            iVar17 = (int)local_940;
          }
          local_910 = uVar12;
          iVar7 = GetPredictionCostCrossColorBlue
                            (local_8e8,iVar17,tile_width,iVar5,prev_x,prev_y,0,0,
                             accumulated_blue_histo);
          uVar12 = 0;
          uVar11 = 0;
          do {
            bVar2 = 0x18 < (int)local_900;
            local_8f0 = CONCAT44(local_8f0._4_4_,(int)(char)(&DAT_001bd740)[uVar12]);
            uVar10 = 0;
            local_8f8 = uVar12;
            uVar15 = uVar13;
            do {
              uVar13 = (char)(&DAT_001bd730)[uVar10 * 2] * (int)local_8f0 + uVar15;
              uVar14 = (char)(&DAT_001bd731)[uVar10 * 2] * (int)local_8f0 + uVar11;
              lVar9 = GetPredictionCostCrossColorBlue
                                (local_8e8,(int)local_940,tile_width,iVar5,prev_x,prev_y,uVar13,
                                 uVar14,accumulated_blue_histo);
              if (iVar7 <= lVar9) {
                lVar9 = iVar7;
                uVar14 = uVar11;
                uVar13 = uVar15;
              }
              uVar11 = uVar14;
              iVar7 = lVar9;
              bVar19 = uVar10 < 7;
              uVar10 = uVar10 + 1;
              uVar15 = uVar13;
            } while ((uVar12 != 4 || bVar2) && bVar19);
          } while ((((2 < local_8f8 - 4) || (uVar11 != 0 || uVar13 != 0)) && (0x18 < (int)local_900)
                   ) && (uVar12 = local_8f8 + 1, uVar12 < local_848));
          uVar15 = (uint)(byte)local_910 | (uVar13 & 0xff) << 8 | uVar11 << 0x10;
          iVar17 = (int)local_940 - (int)local_908;
          if ((int)local_918 < iVar17) {
            iVar17 = (int)local_918;
          }
          local_920[local_858] = uVar15 | 0xff000000;
          local_944.red_to_blue = (uint8_t)uVar11;
          local_944._0_2_ = SUB42(uVar15,0);
          if (0 < (int)local_870) {
            puVar16 = local_8a8 + ((int)local_8b8 + (int)local_908);
            iVar18 = local_8dc;
            do {
              (*VP8LTransformColor)(&local_944,puVar16,iVar17);
              iVar18 = iVar18 + -1;
              puVar16 = (uint32_t *)((long)puVar16 + local_840);
            } while (1 < iVar18);
          }
          if ((int)local_8b0 < (int)local_8d8) {
            iVar17 = (int)local_8b8 + (int)local_908;
            uVar12 = local_8b0;
            do {
              iVar18 = (int)uVar12 * (int)local_940;
              if (iVar18 + (int)local_908 < iVar18 + local_924) {
                lVar9 = (long)iVar17;
                iVar18 = tile_width;
                do {
                  uVar15 = local_8a8[lVar9];
                  if ((((lVar9 < 2) || (uVar15 != local_8a8[lVar9 + -2])) ||
                      (uVar15 != local_8a8[lVar9 + -1])) &&
                     (((lVar9 < local_880 || (local_8a8[lVar9 + -2] != local_890[lVar9 + -2])) ||
                      ((local_8a8[lVar9 + -1] != local_890[lVar9 + -1] ||
                       (uVar15 != local_890[lVar9])))))) {
                    piVar1 = (int *)((long)accumulated_red_histo + (ulong)(uVar15 >> 0xe & 0x3fc));
                    *piVar1 = *piVar1 + 1;
                    accumulated_blue_histo[uVar15 & 0xff] =
                         accumulated_blue_histo[uVar15 & 0xff] + 1;
                  }
                  lVar9 = lVar9 + 1;
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
              }
              uVar15 = (int)uVar12 + 1;
              uVar12 = (ulong)uVar15;
              iVar17 = iVar17 + (int)local_940;
            } while (uVar15 != local_8d8);
          }
          uVar12 = local_850 + 1;
          argb = local_8a8;
        } while (uVar12 != local_888);
      }
      iVar5 = WebPReportProgress(pic,((int)local_8c0 * percent_range) / (int)local_938 +
                                     (int)local_898,percent);
      if (iVar5 == 0) {
        return 0;
      }
      uVar12 = local_8c0 + 1;
      width = (int)local_940;
    } while (uVar12 != local_8a0);
  }
  VP8LOptimizeSampling(local_920,width,(int)local_8d0,bits,9,best_bits);
  return 1;
}

Assistant:

int VP8LColorSpaceTransform(int width, int height, int bits, int quality,
                            uint32_t* const argb, uint32_t* image,
                            const WebPPicture* const pic, int percent_range,
                            int* const percent, int* const best_bits) {
  const int max_tile_size = 1 << bits;
  const int tile_xsize = VP8LSubSampleSize(width, bits);
  const int tile_ysize = VP8LSubSampleSize(height, bits);
  int percent_start = *percent;
  uint32_t accumulated_red_histo[256] = { 0 };
  uint32_t accumulated_blue_histo[256] = { 0 };
  int tile_x, tile_y;
  VP8LMultipliers prev_x, prev_y;
  MultipliersClear(&prev_y);
  MultipliersClear(&prev_x);
  for (tile_y = 0; tile_y < tile_ysize; ++tile_y) {
    for (tile_x = 0; tile_x < tile_xsize; ++tile_x) {
      int y;
      const int tile_x_offset = tile_x * max_tile_size;
      const int tile_y_offset = tile_y * max_tile_size;
      const int all_x_max = GetMin(tile_x_offset + max_tile_size, width);
      const int all_y_max = GetMin(tile_y_offset + max_tile_size, height);
      const int offset = tile_y * tile_xsize + tile_x;
      if (tile_y != 0) {
        ColorCodeToMultipliers(image[offset - tile_xsize], &prev_y);
      }
      prev_x = GetBestColorTransformForTile(tile_x, tile_y, bits,
                                            prev_x, prev_y,
                                            quality, width, height,
                                            accumulated_red_histo,
                                            accumulated_blue_histo,
                                            argb);
      image[offset] = MultipliersToColorCode(&prev_x);
      CopyTileWithColorTransform(width, height, tile_x_offset, tile_y_offset,
                                 max_tile_size, prev_x, argb);

      // Gather accumulated histogram data.
      for (y = tile_y_offset; y < all_y_max; ++y) {
        int ix = y * width + tile_x_offset;
        const int ix_end = ix + all_x_max - tile_x_offset;
        for (; ix < ix_end; ++ix) {
          const uint32_t pix = argb[ix];
          if (ix >= 2 &&
              pix == argb[ix - 2] &&
              pix == argb[ix - 1]) {
            continue;  // repeated pixels are handled by backward references
          }
          if (ix >= width + 2 &&
              argb[ix - 2] == argb[ix - width - 2] &&
              argb[ix - 1] == argb[ix - width - 1] &&
              pix == argb[ix - width]) {
            continue;  // repeated pixels are handled by backward references
          }
          ++accumulated_red_histo[(pix >> 16) & 0xff];
          ++accumulated_blue_histo[(pix >> 0) & 0xff];
        }
      }
    }
    if (!WebPReportProgress(
            pic, percent_start + percent_range * tile_y / tile_ysize,
            percent)) {
      return 0;
    }
  }
  VP8LOptimizeSampling(image, width, height, bits, MAX_TRANSFORM_BITS,
                       best_bits);
  return 1;
}